

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureBorderColorCase::test
          (TextureBorderColorCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  QueryType QVar3;
  GLenum GVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  ScopedLogSection section;
  ScopedLogSection section_1;
  ScopedLogSection section_3;
  string local_118;
  string local_f8;
  ScopedLogSection local_d8;
  long local_d0;
  TestLog local_c8;
  long lStack_c0;
  string local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ScopedLogSection local_78;
  GLenum local_70;
  Vec4 local_68;
  ScopedLogSection local_50;
  IVec4 local_48;
  
  QVar3 = (this->super_TextureTest).m_type;
  if (QVar3 - QUERY_TEXTURE_PARAM_INTEGER_VEC4 < 2) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Initial","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_d8,pTVar2,&local_118,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    StateQueryUtil::verifyStateTextureParamFloatVec4
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (Vec4 *)&local_118,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_d8.m_log);
    QVar3 = (this->super_TextureTest).m_type;
  }
  if (QVar3 != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4) {
    if (QVar3 != QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4) {
      pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      paVar1 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Set","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
      tcu::ScopedLogSection::ScopedLogSection(&local_50,pTVar2,&local_118,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_68.m_data[0] = 0.25;
      local_68.m_data[1] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.77;
      local_48.m_data[0] = 0x8000000;
      local_48.m_data[1] = 0x7fffffff;
      local_48.m_data[2] = 0;
      local_48.m_data[3] = 0xfffffff;
      glu::CallLogWrapper::glTexParameterfv
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_68.m_data);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
        local_78.m_log = (TestLog *)glu::getErrorName;
        local_70 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_78);
        uVar7 = 0xf;
        if (local_98 != local_88) {
          uVar7 = local_88[0];
        }
        if (uVar7 < local_b8._M_string_length + local_90) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar8 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_b8._M_string_length + local_90) goto LAB_01843e2f;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_01843e2f:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
        }
        local_d8.m_log = &local_c8;
        pTVar2 = (TestLog *)(plVar5 + 2);
        if ((TestLog *)*plVar5 == pTVar2) {
          local_c8.m_log = pTVar2->m_log;
          lStack_c0 = plVar5[3];
        }
        else {
          local_c8.m_log = pTVar2->m_log;
          local_d8.m_log = (TestLog *)*plVar5;
        }
        local_d0 = plVar5[1];
        *plVar5 = (long)pTVar2;
        plVar5[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_f8.field_2._M_allocated_capacity = *psVar6;
          local_f8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar6;
          local_f8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_f8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_118.field_2._M_allocated_capacity = *psVar6;
          local_118.field_2._8_8_ = plVar5[3];
          local_118._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar6;
          local_118._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_118._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8.m_log != &local_c8) {
          operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamFloatVec4
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 &local_68,(this->super_TextureTest).m_type);
      glu::CallLogWrapper::glTexParameteriv
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_48.m_data);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 == 0) goto LAB_018445c9;
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
      local_78.m_log = (TestLog *)glu::getErrorName;
      local_70 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_78);
      uVar7 = 0xf;
      if (local_98 != local_88) {
        uVar7 = local_88[0];
      }
      if (uVar7 < local_b8._M_string_length + local_90) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar8 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_b8._M_string_length + local_90) goto LAB_0184442e;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_0184442e:
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
      }
      local_d8.m_log = &local_c8;
      pTVar2 = (TestLog *)(plVar5 + 2);
      if ((TestLog *)*plVar5 == pTVar2) {
        local_c8.m_log = pTVar2->m_log;
        lStack_c0 = plVar5[3];
      }
      else {
        local_c8.m_log = pTVar2->m_log;
        local_d8.m_log = (TestLog *)*plVar5;
      }
      local_d0 = plVar5[1];
      *plVar5 = (long)pTVar2;
      plVar5[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_f8.field_2._M_allocated_capacity = *psVar6;
        local_f8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar6;
        local_f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_118.field_2._M_allocated_capacity = *psVar6;
        local_118.field_2._8_8_ = plVar5[3];
        local_118._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar6;
        local_118._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_118._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8.m_log != &local_c8) {
        operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
LAB_018445c9:
      StateQueryUtil::verifyStateTextureParamNormalizedI32Vec4
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 &local_48,(this->super_TextureTest).m_type);
      tcu::TestLog::endSection(local_50.m_log);
      return;
    }
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Set","");
    paVar1 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
    tcu::ScopedLogSection::ScopedLogSection(&local_78,pTVar2,&local_118,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_68.m_data[0] = NAN;
    local_68.m_data[1] = -NAN;
    local_68.m_data[2] = 4.2039e-45;
    local_68.m_data[3] = -NAN;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_68);
    GVar4 = glu::CallLogWrapper::glGetError(gl);
    if (GVar4 == 0) goto LAB_01843fcd;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
    local_48.m_data._0_8_ = glu::getErrorName;
    local_48.m_data[2] = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
    uVar7 = 0xf;
    if (local_98 != local_88) {
      uVar7 = local_88[0];
    }
    if (uVar7 < local_b8._M_string_length + local_90) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar8 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_b8._M_string_length + local_90) goto LAB_01843b3e;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
      ;
    }
    else {
LAB_01843b3e:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
    }
    local_d8.m_log = &local_c8;
    pTVar2 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar2) {
      local_c8.m_log = pTVar2->m_log;
      lStack_c0 = plVar5[3];
    }
    else {
      local_c8.m_log = pTVar2->m_log;
      local_d8.m_log = (TestLog *)*plVar5;
    }
    local_d0 = plVar5[1];
    *plVar5 = (long)pTVar2;
    plVar5[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8.field_2._8_8_ = plVar5[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_118.field_2._M_allocated_capacity = *psVar6;
      local_118.field_2._8_8_ = plVar5[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar6;
      local_118._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8.m_log != &local_c8) {
      operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
LAB_01843fcd:
    StateQueryUtil::verifyStateTextureParamIntegerVec4
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (IVec4 *)&local_68,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_78.m_log);
    return;
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Set","");
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_78,pTVar2,&local_118,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_68.m_data[0] = 3.85186e-34;
  local_68.m_data[1] = 2.8026e-45;
  local_68.m_data[2] = 4.2039e-45;
  local_68.m_data[3] = 1.79366e-43;
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (GLuint *)&local_68);
  GVar4 = glu::CallLogWrapper::glGetError(gl);
  if (GVar4 == 0) goto LAB_0184418d;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
  local_48.m_data._0_8_ = glu::getErrorName;
  local_48.m_data[2] = GVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b8,&local_48);
  uVar7 = 0xf;
  if (local_98 != local_88) {
    uVar7 = local_88[0];
  }
  if (uVar7 < local_b8._M_string_length + local_90) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar8 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_b8._M_string_length + local_90) goto LAB_01843caf;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_01843caf:
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
  }
  local_d8.m_log = &local_c8;
  pTVar2 = (TestLog *)(plVar5 + 2);
  if ((TestLog *)*plVar5 == pTVar2) {
    local_c8.m_log = pTVar2->m_log;
    lStack_c0 = plVar5[3];
  }
  else {
    local_c8.m_log = pTVar2->m_log;
    local_d8.m_log = (TestLog *)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)pTVar2;
  plVar5[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar5[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_118.field_2._M_allocated_capacity = *psVar6;
    local_118.field_2._8_8_ = plVar5[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar6;
    local_118._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_118._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8.m_log != &local_c8) {
    operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_0184418d:
  StateQueryUtil::verifyStateTextureParamUnsignedIntegerVec4
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (UVec4 *)&local_68,(this->super_TextureTest).m_type);
  tcu::TestLog::endSection(local_78.m_log);
  return;
}

Assistant:

void TextureBorderColorCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	// border color is undefined if queried with pure type and was not set to pure value
	if (m_type == QUERY_TEXTURE_PARAM_INTEGER_VEC4 || m_type == QUERY_TEXTURE_PARAM_FLOAT_VEC4)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamFloatVec4(result, gl, m_target, m_pname, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), m_type);
	}

	if (m_type == QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::IVec4			color			(0x7FFFFFFF, -2, 3, -128);

		gl.glTexParameterIiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");

		verifyStateTextureParamIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else if (m_type == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::UVec4			color			(0x8000000ul, 2, 3, 128);

		gl.glTexParameterIuiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");

		verifyStateTextureParamUnsignedIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else
	{
		DE_ASSERT(m_type == QUERY_TEXTURE_PARAM_INTEGER_VEC4 || m_type == QUERY_TEXTURE_PARAM_FLOAT_VEC4);

		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::Vec4				color			(0.25f, 1.0f, 0.0f, 0.77f);
		const tcu::IVec4			icolor			(0x8000000ul, 0x7FFFFFFF, 0, 0x0FFFFFFF);

		gl.glTexParameterfv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterfv");

		verifyStateTextureParamFloatVec4(result, gl, m_target, m_pname, color, m_type);

		gl.glTexParameteriv(m_target, m_pname, icolor.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteriv");

		verifyStateTextureParamNormalizedI32Vec4(result, gl, m_target, m_pname, icolor, m_type);
	}
}